

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini2sf.cpp
# Opt level: O3

void printUsage(char *cmd)

{
  printf("%s %s\n","rom2sf","[2015-04-08]");
  puts("======================");
  putchar(10);
  printf("%s. Created by %s.\n","Numbered mini2sf generator",
         "loveemu <http://github.com/loveemu/rom2sf>");
  putchar(10);
  puts("Usage");
  puts("-----");
  putchar(10);
  printf("Syntax: `%s <Base name> <Offset> <Size> <Count>`\n",cmd);
  putchar(10);
  puts("### Options ###");
  putchar(10);
  puts("--help");
  printf("  : %s\n","Show this help");
  putchar(10);
  puts("--psfby, --2sfby [name]");
  printf("  : %s\n","Set creator name of 2SF");
  putchar(10);
  return;
}

Assistant:

void printUsage(const char *cmd)
{
	const char *availableOptions[] = {
		"--help", "Show this help",
		"--psfby, --2sfby [name]", "Set creator name of 2SF",
	};

	printf("%s %s\n", APP_NAME, APP_VER);
	printf("======================\n");
	printf("\n");
	printf("%s. Created by %s.\n", APP_DESC, APP_AUTHOR);
	printf("\n");
	printf("Usage\n");
	printf("-----\n");
	printf("\n");
	printf("Syntax: `%s <Base name> <Offset> <Size> <Count>`\n", cmd);
	printf("\n");
	printf("### Options ###\n");
	printf("\n");

	for (int i = 0; i < sizeof(availableOptions) / sizeof(availableOptions[0]); i += 2)
	{
		printf("%s\n", availableOptions[i]);
		printf("  : %s\n", availableOptions[i + 1]);
		printf("\n");
	}
}